

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

bool __thiscall
ON_SubDMatrix::EvaluateSubdivisionPoint
          (ON_SubDMatrix *this,uint element_index,double *point_ring,size_t point_ring_count,
          size_t point_ring_stride,double *subd_point)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  bool bVar4;
  double *s1;
  double *s;
  double c;
  double *subd_point_local;
  size_t point_ring_stride_local;
  size_t point_ring_count_local;
  double *point_ring_local;
  uint element_index_local;
  ON_SubDMatrix *this_local;
  
  if ((this->m_S == (double **)0x0) || (this->m_R <= element_index)) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    bVar4 = IsValidPointRing(this,point_ring,point_ring_count,point_ring_stride);
    if (bVar4) {
      *subd_point = 0.0;
      subd_point[1] = 0.0;
      subd_point[2] = 0.0;
      pdVar3 = this->m_S[element_index];
      uVar2 = this->m_R;
      s1 = pdVar3;
      point_ring_count_local = (size_t)point_ring;
      while (s1 < pdVar3 + uVar2) {
        dVar1 = *s1;
        *subd_point = dVar1 * *(double *)point_ring_count_local + *subd_point;
        subd_point[1] = dVar1 * *(double *)(point_ring_count_local + 8) + subd_point[1];
        subd_point[2] = dVar1 * *(double *)(point_ring_count_local + 0x10) + subd_point[2];
        point_ring_count_local = point_ring_stride * 8 + point_ring_count_local;
        s1 = s1 + 1;
      }
      this_local._7_1_ = true;
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMatrix::EvaluateSubdivisionPoint(
  unsigned int element_index,
  const double* point_ring,
  size_t point_ring_count,
  size_t point_ring_stride,
  double subd_point[3]
  ) const
{
  if ( nullptr == m_S || element_index >= m_R )
    return ON_SUBD_RETURN_ERROR(false);
  if (false == IsValidPointRing(point_ring,point_ring_count,point_ring_stride))
    return ON_SUBD_RETURN_ERROR(false);
 
  subd_point[0] = 0.0;
  subd_point[1] = 0.0;
  subd_point[2] = 0.0;
  double c;
  const double* s = m_S[element_index];
  const double* s1 = s + m_R;
  while (s < s1)
  {
    c = *s++;
    subd_point[0] += c*point_ring[0];
    subd_point[1] += c*point_ring[1];
    subd_point[2] += c*point_ring[2];
    point_ring += point_ring_stride;
  }

  return true;
}